

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_3D_C.cpp
# Opt level: O3

void amrex::EB2::build_cells
               (Box *bx,Array4<amrex::EBCellFlag> *cell,Array4<unsigned_int> *fx,
               Array4<unsigned_int> *fy,Array4<unsigned_int> *fz,Array4<double> *apx,
               Array4<double> *apy,Array4<double> *apz,Array4<const_double> *fcx,
               Array4<const_double> *fcy,Array4<const_double> *fcz,Array4<const_double> *m2x,
               Array4<const_double> *m2y,Array4<const_double> *m2z,Array4<double> *vfrac,
               Array4<double> *vcent,Array4<double> *barea,Array4<double> *bcent,
               Array4<double> *bnorm,Array4<amrex::EBCellFlag> *ctmp,Array4<double> *levset,
               Real small_volfrac,Geometry *geom,bool extend_domain_face,bool cover_multiple_cuts,
               int *nsmallcells,int *nmulticuts)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  EBCellFlag *pEVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  uint *puVar16;
  uint *puVar17;
  EBCellFlag *pEVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  int idim;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  uint uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  short sVar50;
  uint uVar51;
  long lVar52;
  long lVar53;
  int iVar54;
  int iVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  uint uVar70;
  long lVar71;
  uint uVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  double dVar76;
  int iVar77;
  double *pdVar78;
  bool bVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  uint *puVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  Box result;
  Box gdomain;
  double local_338;
  int local_318;
  undefined8 local_238;
  uint uStack_230;
  uint auStack_22c [2];
  undefined8 local_224;
  Array4<const_double> *local_218;
  Array4<amrex::EBCellFlag> *local_210;
  double *local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  Array4<double> *local_1e0;
  Array4<const_double> *local_1d8;
  uint local_1d0;
  int local_1cc;
  undefined8 local_1c8;
  uint uStack_1c0;
  uint auStack_1bc [2];
  undefined8 uStack_1b4;
  double local_1a8;
  undefined8 uStack_1a0;
  uint *local_198;
  undefined8 uStack_190;
  Array4<unsigned_int> *local_180;
  int *local_178;
  Array4<const_double> *local_170;
  uint local_164;
  uint local_160;
  int local_15c;
  double local_158;
  undefined8 uStack_150;
  uint *local_148;
  undefined8 uStack_140;
  ulong local_130;
  ulong local_128;
  Array4<unsigned_int> *local_120;
  Array4<const_double> *local_118;
  Real local_110;
  double local_108;
  undefined8 uStack_100;
  ulong local_f0;
  Array4<unsigned_int> *local_e8;
  int local_dc;
  double local_d8;
  undefined8 uStack_d0;
  EBCellFlag *local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  uint *local_98;
  undefined8 uStack_90;
  Box *local_80;
  Geometry *local_78;
  int *local_70;
  int *local_68;
  Array4<double> *local_60;
  long local_58;
  ulong local_50;
  Array4<const_double> *local_48;
  Array4<const_double> *local_40;
  double local_38;
  
  local_70 = nmulticuts;
  local_68 = nsmallcells;
  local_78 = geom;
  local_60 = levset;
  local_210 = ctmp;
  local_40 = m2z;
  local_170 = m2y;
  local_48 = m2x;
  local_218 = fcz;
  local_1d8 = fcy;
  local_118 = fcx;
  local_180 = fy;
  local_120 = fz;
  local_110 = small_volfrac;
  local_e8 = fx;
  local_178 = (int *)malloc(8);
  local_178[0] = 0;
  local_178[1] = 0;
  uVar19 = *(undefined8 *)(bx->smallend).vect;
  local_f0 = *(ulong *)((bx->smallend).vect + 2);
  uVar20 = *(undefined8 *)(bx->bigend).vect;
  uVar21 = *(ulong *)((bx->bigend).vect + 2);
  uStack_230 = (uint)local_f0;
  auStack_22c[0] = (uint)uVar20;
  uVar10 = auStack_22c[0];
  auStack_22c[1] = (uint)((ulong)uVar20 >> 0x20);
  local_238._0_4_ = (int)uVar19;
  iVar22 = (int)local_238;
  local_238._4_4_ = (uint)((ulong)uVar19 >> 0x20);
  local_50 = (ulong)local_238._4_4_;
  iVar39 = (int)local_238 + -1;
  local_1d0 = local_238._4_4_ - 1;
  local_238 = CONCAT44(local_1d0,iVar39);
  local_f0 = local_f0 & 0xffffffff;
  uVar51 = uStack_230 - 1;
  uStack_230 = uVar51;
  local_160 = auStack_22c[0] + 1;
  auStack_22c[0] = local_160;
  local_128 = (ulong)auStack_22c[1];
  local_224._0_4_ = (uint)uVar21;
  local_130 = uVar21 & 0xffffffff;
  local_164 = auStack_22c[1] + 1;
  auStack_22c[1] = local_164;
  local_dc = (uint)local_224 + 1;
  local_224._4_4_ = (uint)(uVar21 >> 0x20);
  local_224 = CONCAT44(local_224._4_4_,local_dc);
  local_1e0 = bnorm;
  local_1cc = iVar39;
  local_80 = bx;
  if ((int)uVar51 <= local_dc) {
    lVar26 = (long)(int)uVar51;
    local_58 = (long)(int)local_1d0;
    lVar43 = (long)iVar39;
    lVar32 = lVar43 * 8;
    do {
      iVar77 = (int)lVar26;
      if ((int)local_1d0 <= (int)local_164) {
        lVar60 = (long)(int)local_f0;
        local_15c = (int)local_50;
        lVar56 = local_58;
        do {
          iVar38 = (int)lVar56;
          if (iVar39 <= (int)local_160) {
            lVar61 = (long)local_15c;
            lVar62 = 0;
            do {
              uVar34 = cell->p[((lVar26 - (cell->begin).z) * cell->kstride +
                               (lVar56 - (cell->begin).y) * cell->jstride + lVar43 + lVar62) -
                               (long)(cell->begin).x].flag & 3;
              if (uVar34 == 3) {
                vfrac->p[((lVar26 - (vfrac->begin).z) * vfrac->kstride +
                         (lVar56 - (vfrac->begin).y) * vfrac->jstride + lVar43 + lVar62) -
                         (long)(vfrac->begin).x] = 0.0;
                lVar71 = (long)(vcent->begin).x;
                lVar27 = (lVar26 - (vcent->begin).z) * vcent->kstride;
                lVar57 = (lVar56 - (vcent->begin).y) * vcent->jstride;
                pdVar12 = vcent->p;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                lVar66 = vcent->nstride;
                pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                lVar71 = (long)(bcent->begin).x;
                lVar27 = (lVar26 - (bcent->begin).z) * bcent->kstride;
                lVar57 = (lVar56 - (bcent->begin).y) * bcent->jstride;
                pdVar12 = bcent->p;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                lVar66 = bcent->nstride;
                pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = -1.0;
                lVar71 = (long)(bnorm->begin).x;
                lVar27 = (lVar26 - (bnorm->begin).z) * bnorm->kstride;
                lVar57 = (lVar56 - (bnorm->begin).y) * bnorm->jstride;
                pdVar12 = bnorm->p;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                lVar66 = bnorm->nstride;
                pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                barea->p[((lVar26 - (barea->begin).z) * barea->kstride +
                         (lVar56 - (barea->begin).y) * barea->jstride + lVar43 + lVar62) -
                         (long)(barea->begin).x] = 0.0;
              }
              else if (uVar34 == 0) {
                vfrac->p[((lVar26 - (vfrac->begin).z) * vfrac->kstride +
                         (lVar56 - (vfrac->begin).y) * vfrac->jstride + lVar43 + lVar62) -
                         (long)(vfrac->begin).x] = 1.0;
                lVar71 = (long)(vcent->begin).x;
                lVar27 = (lVar26 - (vcent->begin).z) * vcent->kstride;
                lVar57 = (lVar56 - (vcent->begin).y) * vcent->jstride;
                pdVar12 = vcent->p;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                lVar66 = vcent->nstride;
                pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                lVar71 = (long)(bcent->begin).x;
                lVar27 = (lVar26 - (bcent->begin).z) * bcent->kstride;
                lVar57 = (lVar56 - (bcent->begin).y) * bcent->jstride;
                pdVar12 = bcent->p;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                lVar66 = bcent->nstride;
                pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = -1.0;
                lVar71 = (long)(bnorm->begin).x;
                lVar27 = (lVar26 - (bnorm->begin).z) * bnorm->kstride;
                lVar57 = (lVar56 - (bnorm->begin).y) * bnorm->jstride;
                pdVar12 = bnorm->p;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                lVar66 = bnorm->nstride;
                pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                barea->p[((lVar26 - (barea->begin).z) * barea->kstride +
                         (lVar56 - (barea->begin).y) * barea->jstride + lVar43 + lVar62) -
                         (long)(barea->begin).x] = 0.0;
              }
              else {
                iVar39 = (apx->begin).x;
                lVar66 = (long)(apx->begin).y;
                lVar27 = (long)iVar38;
                lVar71 = (long)(apx->begin).z;
                local_1f8 = (double)(long)iVar77;
                iVar23 = (int)lVar62;
                dVar76 = apx->p[lVar43 + (((lVar26 - lVar71) * apx->kstride +
                                          (lVar56 - lVar66) * apx->jstride + lVar62) - (long)iVar39)
                               ];
                dVar81 = apx->p[(lVar27 - lVar66) * apx->jstride +
                                (long)((iVar22 + iVar23) - iVar39) +
                                ((long)local_1f8 - lVar71) * apx->kstride];
                lVar66 = (long)(apy->begin).x;
                lVar71 = (long)(apy->begin).y;
                lVar29 = (lVar26 - (apy->begin).z) * apy->kstride;
                lVar57 = apy->jstride * 8;
                dVar82 = *(double *)
                          ((long)apy->p +
                          lVar62 * 8 +
                          (lVar56 - lVar71) * lVar57 + lVar29 * 8 + lVar66 * -8 + lVar32);
                dVar84 = *(double *)
                          ((long)apy->p +
                          lVar62 * 8 +
                          (lVar61 - lVar71) * lVar57 + lVar29 * 8 + lVar66 * -8 + lVar32);
                lVar66 = (long)(apz->begin).x;
                lVar71 = (long)(apz->begin).z;
                lVar29 = apz->kstride * 8;
                lVar57 = (lVar56 - (apz->begin).y) * apz->jstride;
                pdVar12 = *(double **)
                           ((long)apz->p +
                           lVar62 * 8 +
                           (lVar26 - lVar71) * lVar29 + lVar57 * 8 + lVar66 * -8 + lVar32);
                dVar85 = *(double *)
                          ((long)apz->p +
                          lVar62 * 8 +
                          (lVar60 - lVar71) * lVar29 + lVar57 * 8 + lVar66 * -8 + lVar32);
                if (((((dVar76 < 0.5) || (1.0 <= dVar76)) || (dVar81 < 0.5)) ||
                    (((1.0 <= dVar81 || (dVar82 < 0.5)) ||
                     ((1.0 <= dVar82 || ((dVar84 < 0.5 || (1.0 <= dVar84)))))))) ||
                   (((double)pdVar12 < 0.5 ||
                    (((1.0 <= (double)pdVar12 || (dVar85 < 0.5)) || (1.0 <= dVar85)))))) {
                  dVar80 = dVar76 - dVar81;
                  dVar97 = dVar82 - dVar84;
                  uStack_200 = 0;
                  dVar90 = (double)pdVar12 - dVar85;
                  local_1a8 = SQRT(dVar90 * dVar90 + dVar80 * dVar80 + dVar97 * dVar97);
                  local_208 = pdVar12;
                  if ((local_1a8 == 0.0) && (!NAN(local_1a8))) {
                    Assert_host("apnorm != 0.0_rt",
                                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_3D_C.cpp"
                                ,0x44,"\"amrex::EB2:build_cells: apnorm==0\"");
                  }
                  dVar93 = 1.0 / local_1a8;
                  puVar94 = (uint *)(dVar80 * dVar93);
                  dVar91 = dVar97 * dVar93;
                  dVar93 = dVar93 * dVar90;
                  lVar29 = (lVar26 - (bnorm->begin).z) * bnorm->kstride;
                  lVar57 = (lVar56 - (bnorm->begin).y) * bnorm->jstride;
                  lVar71 = (long)(bnorm->begin).x;
                  pdVar12 = bnorm->p;
                  pdVar12[lVar43 + ((lVar29 + lVar57 + lVar62) - lVar71)] = (double)puVar94;
                  lVar66 = bnorm->nstride;
                  pdVar12[lVar43 + ((lVar66 + lVar29 + lVar57 + lVar62) - lVar71)] = dVar91;
                  pdVar12[lVar43 + ((lVar29 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = dVar93;
                  barea->p[((lVar26 - (barea->begin).z) * barea->kstride +
                           (lVar56 - (barea->begin).y) * barea->jstride + lVar43 + lVar62) -
                           (long)(barea->begin).x] =
                       dVar90 * dVar93 + dVar80 * (double)puVar94 + dVar97 * dVar91;
                  lVar44 = (long)(local_1d8->begin).x;
                  lVar71 = (long)(local_1d8->begin).y;
                  lVar29 = (lVar26 - (local_1d8->begin).z) * local_1d8->kstride;
                  lVar57 = local_1d8->jstride * 8;
                  lVar66 = (lVar56 - lVar71) * lVar57 + lVar29 * 8;
                  pdVar13 = local_1d8->p;
                  lVar71 = (lVar61 - lVar71) * lVar57 + lVar29 * 8;
                  lVar46 = (long)(local_218->begin).x;
                  lVar29 = local_218->jstride;
                  lVar30 = (long)(local_218->begin).z;
                  lVar57 = local_218->kstride * 8;
                  local_198 = (uint *)((lVar26 - lVar30) * lVar57);
                  lVar59 = (lVar56 - (local_218->begin).y) * lVar29;
                  pdVar78 = local_218->p + lVar43;
                  local_158 = (double)((lVar60 - lVar30) * lVar57);
                  lVar57 = (long)local_158 + lVar59 * 8;
                  lVar30 = (long)(local_118->begin).y;
                  lVar45 = (long)(local_118->begin).z;
                  lVar37 = (lVar26 - lVar45) * local_118->kstride;
                  lVar31 = (lVar56 - lVar30) * local_118->jstride;
                  pdVar14 = local_118->p;
                  iVar39 = (local_118->begin).x;
                  lVar36 = (long)iVar39;
                  pdVar12 = pdVar14 + (lVar27 - lVar30) * local_118->jstride +
                                      (long)((iVar22 + iVar23) - iVar39) +
                                      ((long)local_1f8 - lVar45) * local_118->kstride;
                  dVar86 = (dVar81 + dVar76) * 0.5;
                  dVar88 = (dVar85 + (double)local_208) * 0.5;
                  dVar97 = (*(double *)
                             ((long)(local_198 + lVar59 * 2 + lVar46 * -2) + (long)pdVar78 +
                             lVar62 * 8) * (double)local_208 -
                           *(double *)((long)pdVar78 + lVar62 * 8 + lVar57 + lVar46 * -8) * dVar85)
                           * dVar93 +
                           ((*(double *)((long)pdVar13 + lVar62 * 8 + lVar66 + lVar44 * -8 + lVar32)
                             * dVar82 -
                            *(double *)((long)pdVar13 + lVar62 * 8 + lVar71 + lVar44 * -8 + lVar32)
                            * dVar84) * dVar91 - dVar86 * (double)puVar94);
                  dVar80 = (dVar82 + dVar84) * 0.5;
                  dVar90 = (*(double *)
                             ((long)(local_198 + lVar59 * 2 + local_218->nstride * 2 + lVar46 * -2)
                              + (long)pdVar78 + lVar62 * 8) * (double)local_208 -
                           *(double *)
                            ((long)pdVar78 +
                            lVar62 * 8 + lVar57 + local_218->nstride * 8 + lVar46 * -8) * dVar85) *
                           dVar93 + ((pdVar14[lVar43 + ((lVar37 + lVar31 + lVar62) - lVar36)] *
                                      dVar76 - *pdVar12 * dVar81) * (double)puVar94 -
                                    dVar80 * dVar91);
                  dVar83 = (*(double *)
                             ((long)pdVar13 +
                             lVar62 * 8 + lVar66 + local_1d8->nstride * 8 + lVar44 * -8 + lVar32) *
                            dVar82 - *(double *)
                                      ((long)pdVar13 +
                                      lVar62 * 8 +
                                      lVar71 + local_1d8->nstride * 8 + lVar44 * -8 + lVar32) *
                                     dVar84) * dVar91 +
                           ((pdVar14[lVar43 + ((local_118->nstride + lVar37 + lVar31 + lVar62) -
                                              lVar36)] * dVar76 -
                            pdVar12[local_118->nstride] * dVar81) * (double)puVar94 -
                           dVar88 * dVar93);
                  lVar57 = (lVar26 - (vfrac->begin).z) * vfrac->kstride;
                  lVar66 = (lVar56 - (vfrac->begin).y) * vfrac->jstride;
                  lVar71 = (long)(vfrac->begin).x;
                  dVar80 = (dVar93 * dVar83 +
                           dVar91 * dVar90 + (double)puVar94 * dVar97 + dVar86 + dVar80 + dVar88) *
                           0.5;
                  pdVar13 = vfrac->p;
                  pdVar13[(lVar57 + lVar66 + lVar43 + lVar62) - lVar71] = dVar80;
                  bnorm = local_1e0;
                  if (local_110 <= dVar80) {
                    dVar86 = 1.0 / barea->p[((lVar26 - (barea->begin).z) * barea->kstride +
                                            (lVar56 - (barea->begin).y) * barea->jstride +
                                            lVar43 + lVar62) - (long)(barea->begin).x];
                    lVar44 = (long)(bcent->begin).x;
                    lVar46 = (lVar26 - (bcent->begin).z) * bcent->kstride;
                    lVar45 = (lVar56 - (bcent->begin).y) * bcent->jstride;
                    pdVar78 = bcent->p;
                    pdVar78[lVar43 + ((lVar46 + lVar45 + lVar62) - lVar44)] =
                         (dVar80 * (double)puVar94 + dVar97) * dVar86;
                    lVar30 = bcent->nstride;
                    pdVar78[lVar43 + ((lVar30 + lVar46 + lVar45 + lVar62) - lVar44)] =
                         (pdVar13[(lVar57 + lVar66 + lVar43 + lVar62) - lVar71] * dVar91 + dVar90) *
                         dVar86;
                    pdVar78[lVar43 + ((lVar46 + lVar45 + lVar30 * 2 + lVar62) - lVar44)] =
                         (pdVar13[(lVar57 + lVar66 + lVar43 + lVar62) - lVar71] * dVar93 + dVar83) *
                         dVar86;
                    lVar44 = (long)(local_1d8->begin).x;
                    lVar57 = (long)(local_1d8->begin).y;
                    lVar71 = (lVar26 - (local_1d8->begin).z) * local_1d8->kstride;
                    lVar30 = local_1d8->jstride * 8;
                    lVar66 = (lVar61 - lVar57) * lVar30 + lVar71 * 8;
                    pdVar13 = local_1d8->p;
                    lVar71 = (lVar56 - lVar57) * lVar30 + lVar71 * 8;
                    lVar29 = lVar29 * (lVar56 - (local_218->begin).y);
                    lVar30 = (long)(local_218->begin).x;
                    lVar57 = (long)local_158 + lVar29 * 8;
                    pdVar78 = local_218->p + lVar43;
                    dVar83 = *(double *)((long)pdVar13 + lVar62 * 8 + lVar66 + lVar44 * -8 + lVar32)
                             * dVar84 +
                             *(double *)((long)pdVar13 + lVar62 * 8 + lVar71 + lVar44 * -8 + lVar32)
                             * dVar82;
                    dVar92 = *(double *)((long)pdVar78 + lVar62 * 8 + lVar57 + lVar30 * -8) * dVar85
                             + *(double *)
                                ((long)(local_198 + lVar29 * 2 + lVar30 * -2) + (long)pdVar78 +
                                lVar62 * 8) * (double)local_208;
                    dVar97 = dVar92 * 0.5 + (dVar81 - dVar76) * 0.5 + dVar83 * 0.5;
                    dVar89 = *pdVar12 * dVar81 +
                             pdVar14[lVar43 + ((lVar37 + lVar31 + lVar62) - lVar36)] * dVar76;
                    dVar87 = *(double *)
                              ((long)pdVar78 +
                              lVar62 * 8 + lVar57 + local_218->nstride * 8 + lVar30 * -8) * dVar85 +
                             *(double *)
                              ((long)(local_198 + lVar29 * 2 + local_218->nstride * 2 + lVar30 * -2)
                               + (long)pdVar78 + lVar62 * 8) * (double)local_208;
                    dVar86 = dVar87 * 0.5 + dVar89 * 0.5 + (dVar84 - dVar82) * 0.5;
                    dVar98 = dVar81 * pdVar12[local_118->nstride] +
                             dVar76 * pdVar14[lVar43 + ((local_118->nstride +
                                                        lVar37 + lVar31 + lVar62) - lVar36)];
                    dVar95 = dVar84 * *(double *)
                                       ((long)pdVar13 +
                                       lVar62 * 8 +
                                       lVar66 + local_1d8->nstride * 8 + lVar44 * -8 + lVar32) +
                             dVar82 * *(double *)
                                       ((long)pdVar13 +
                                       lVar62 * 8 +
                                       lVar71 + local_1d8->nstride * 8 + lVar44 * -8 + lVar32);
                    dVar80 = (dVar85 - (double)local_208) * 0.5 + dVar98 * 0.5 + dVar95 * 0.5;
                    dVar90 = -dVar91;
                    lVar36 = (long)(local_170->begin).x;
                    lVar71 = (long)(local_170->begin).y;
                    lVar57 = (lVar26 - (local_170->begin).z) * local_170->kstride;
                    lVar29 = local_170->jstride * 8;
                    lVar66 = (lVar61 - lVar71) * lVar29 + lVar57 * 8;
                    pdVar12 = local_170->p;
                    lVar71 = (lVar56 - lVar71) * lVar29 + lVar57 * 8;
                    uStack_1a0 = 0;
                    dVar88 = -dVar93;
                    lVar37 = (long)(local_40->begin).x;
                    lVar30 = (long)(local_40->begin).z;
                    lVar29 = (lVar56 - (local_40->begin).y) * local_40->jstride;
                    lVar31 = local_40->kstride * 8;
                    lVar57 = (lVar60 - lVar30) * lVar31 + lVar29 * 8;
                    pdVar13 = local_40->p;
                    lVar29 = (lVar26 - lVar30) * lVar31 + lVar29 * 8;
                    dVar96 = (*(double *)
                               ((long)pdVar13 + lVar62 * 8 + lVar57 + lVar37 * -8 + lVar32) -
                             *(double *)((long)pdVar13 + lVar62 * 8 + lVar29 + lVar37 * -8 + lVar32)
                             ) * dVar88 +
                             (double)puVar94 * -0.25 * (dVar81 - dVar76) +
                             (*(double *)
                               ((long)pdVar12 + lVar62 * 8 + lVar66 + lVar36 * -8 + lVar32) -
                             *(double *)((long)pdVar12 + lVar62 * 8 + lVar71 + lVar36 * -8 + lVar32)
                             ) * dVar90;
                    iVar39 = (local_48->begin).x;
                    lVar64 = (long)iVar39;
                    lVar59 = (long)((iVar22 + iVar23) - iVar39);
                    lVar30 = (long)(local_48->begin).y;
                    pdVar14 = local_48->p;
                    lVar44 = (lVar27 - lVar30) * local_48->jstride;
                    lVar27 = (long)(local_48->begin).z;
                    lVar45 = ((long)local_1f8 - lVar27) * local_48->kstride;
                    lVar63 = (lVar26 - lVar27) * local_48->kstride;
                    dVar76 = -(double)puVar94;
                    lVar46 = (lVar56 - lVar30) * local_48->jstride;
                    lVar27 = local_40->nstride;
                    local_38 = (*(double *)
                                 ((long)pdVar13 +
                                 lVar62 * 8 + lVar57 + lVar27 * 8 + lVar37 * -8 + lVar32) -
                               *(double *)
                                ((long)pdVar13 +
                                lVar62 * 8 + lVar29 + lVar27 * 8 + lVar37 * -8 + lVar32)) * dVar88 +
                               (pdVar14[lVar44 + lVar59 + lVar45] -
                               pdVar14[lVar43 + ((lVar63 + lVar46 + lVar62) - lVar64)]) * dVar76 +
                               dVar91 * -0.25 * (dVar84 - dVar82);
                    lVar30 = local_48->nstride;
                    lVar31 = local_170->nstride;
                    local_1f8 = dVar93 * -0.25 * (dVar85 - (double)local_208) +
                                (pdVar14[lVar44 + lVar59 + lVar45 + lVar30] -
                                pdVar14[lVar43 + ((lVar30 + lVar63 + lVar46 + lVar62) - lVar64)]) *
                                dVar76 + (*(double *)
                                           ((long)pdVar12 +
                                           lVar62 * 8 + lVar66 + lVar31 * 8 + lVar36 * -8 + lVar32)
                                         - *(double *)
                                            ((long)pdVar12 +
                                            lVar62 * 8 + lVar71 + lVar31 * 8 + lVar36 * -8 + lVar32)
                                         ) * dVar90;
                    uStack_1f0 = 0;
                    dVar88 = (*(double *)
                               ((long)pdVar13 +
                               lVar62 * 8 + lVar57 + lVar27 * 0x10 + lVar37 * -8 + lVar32) -
                             *(double *)
                              ((long)pdVar13 +
                              lVar62 * 8 + lVar27 * 0x10 + lVar29 + lVar37 * -8 + lVar32)) * dVar88
                             + dVar89 * (double)puVar94 * -0.5 + dVar83 * dVar91 * -0.5;
                    local_d8 = dVar92 * dVar93 * -0.5 +
                               (double)puVar94 * -0.5 * dVar98 +
                               (*(double *)
                                 ((long)pdVar12 +
                                 lVar62 * 8 + lVar66 + lVar31 * 0x10 + lVar36 * -8 + lVar32) -
                               *(double *)
                                ((long)pdVar12 +
                                lVar62 * 8 + lVar31 * 0x10 + lVar71 + lVar36 * -8 + lVar32)) *
                               dVar90;
                    dVar92 = dVar93 * -0.5 * dVar87 +
                             (pdVar14[lVar44 + lVar59 + lVar45 + lVar30 * 2] -
                             pdVar14[lVar43 + ((lVar63 + lVar46 + lVar30 * 2 + lVar62) - lVar64)]) *
                             dVar76 + dVar91 * -0.5 * dVar95;
                    uStack_d0 = 0;
                    dVar90 = dVar91 * dVar91;
                    dVar81 = dVar90 * -3.0 + 5.0;
                    local_198 = (uint *)(dVar90 * -4.0);
                    uStack_190 = 0;
                    dVar85 = dVar90 + dVar90;
                    local_158 = dVar91 * dVar90;
                    uStack_150 = 0;
                    local_a8 = dVar91 * local_158;
                    uStack_a0 = 0;
                    uStack_200 = 0;
                    local_108 = dVar93 * dVar93;
                    dVar76 = local_d8 * 5.0 * (dVar90 + -2.0) - (double)puVar94 * dVar92 * dVar91;
                    dVar84 = dVar93 * local_108;
                    local_208 = (double *)(dVar93 * dVar84);
                    uStack_b0 = 0;
                    local_98 = (uint *)(dVar91 * (dVar88 + dVar88) * (double)local_208 +
                                       (dVar76 + dVar76) * dVar84 +
                                       ((dVar90 * 8.0 + -15.0) * dVar97 +
                                       ((dVar96 * 16.0 + (local_38 + local_1f8) * -4.0) *
                                        (double)puVar94 + dVar88 * 10.0 * dVar91) * dVar90 +
                                       dVar88 * -22.0 * dVar91 +
                                       (double)puVar94 * -2.0 *
                                       (dVar86 * dVar91 + dVar96 * 15.0 + local_1f8 * -5.0)) *
                                       local_108 +
                                       ((((local_38 + local_38) * dVar91 + dVar86) * (double)puVar94
                                        + ((double)local_198 + 6.0) * dVar88) * dVar91 +
                                       dVar81 * dVar97 +
                                       (double)puVar94 * (dVar96 + dVar96) * dVar81) * 5.0 +
                                       ((dVar90 * -11.0 + 15.0 + local_a8) * (local_d8 + local_d8) +
                                       ((5.0 - dVar85) * dVar80 +
                                       dVar92 * -2.0 * dVar91 * (dVar90 + -5.0)) * (double)puVar94)
                                       * dVar93);
                    uStack_90 = 0;
                    dVar82 = (dVar88 + dVar88) * (double)puVar94;
                    dVar97 = dVar97 * (double)puVar94;
                    local_c8 = (EBCellFlag *)
                               ((dVar90 + 4.0) * (local_d8 + local_d8) * (double)puVar94);
                    uStack_c0 = 0;
                    dVar95 = local_38 * -4.0 + dVar96 + local_1f8;
                    uStack_100 = 0;
                    dVar87 = local_1f8 * -4.0 + local_38 + dVar96;
                    dVar83 = dVar80 * dVar91 + (dVar90 * -3.0 + 4.0) * dVar92;
                    dVar76 = dVar88 * (double)puVar94 + dVar86;
                    dVar89 = (dVar87 + dVar87) * dVar90 +
                             dVar76 * dVar91 + dVar96 * -5.0 + local_1f8 * 15.0;
                    dVar81 = 1.0 / ((vfrac->p[((lVar26 - (vfrac->begin).z) * vfrac->kstride +
                                              (lVar56 - (vfrac->begin).y) * vfrac->jstride +
                                              lVar43 + lVar62) - (long)(vfrac->begin).x] + 1e-30) *
                                   ((local_108 * -3.0 + 2.0 + (double)local_208) * dVar85 +
                                   (local_108 + -2.0) * (local_a8 + local_a8) +
                                   (double)local_208 * -4.0 + local_108 * 4.0 + 5.0) * 10.0);
                    lVar71 = (long)(vcent->begin).x;
                    lVar27 = (lVar26 - (vcent->begin).z) * vcent->kstride;
                    lVar57 = (lVar56 - (vcent->begin).y) * vcent->jstride;
                    pdVar12 = vcent->p;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] =
                         (double)local_98 * dVar81;
                    lVar66 = vcent->nstride;
                    pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] =
                         (dVar92 * -8.0 * dVar93 * (double)local_208 +
                         (dVar76 * -8.0 + dVar95 * 4.0 * dVar91) * (double)local_208 +
                         (dVar83 + dVar83) * dVar84 +
                         (((dVar95 + dVar95) * dVar90 +
                          ((local_1f8 * 3.0 + dVar96 * -7.0 + local_38 * 8.0) - dVar97)) *
                          (dVar91 + dVar91) +
                         (dVar90 * -5.0 + 4.0) * dVar82 + dVar86 * -8.0 * (dVar90 + -1.0)) *
                         local_108 +
                         (((dVar90 * 6.0 + 4.0) * local_38 +
                          dVar96 * -2.0 * (dVar90 + -1.0) + dVar97) * dVar91 +
                         (dVar85 + 1.0) * dVar82 + (dVar90 * 3.0 + 2.0) * dVar86) * 5.0 +
                         ((dVar90 * 9.0 + 5.0 + local_a8) * (dVar92 + dVar92) +
                         ((dVar85 + 3.0) * dVar80 + (double)local_c8) * dVar91) * dVar93) * dVar81;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] =
                         dVar81 * ((dVar92 + dVar92) * dVar91 * (double)local_208 +
                                  (dVar89 + dVar89) * dVar84 +
                                  (local_d8 * -10.0 * (double)puVar94 * (dVar90 + -2.0) +
                                  (dVar90 * -8.0 + 15.0) * dVar80 +
                                  dVar92 * -6.0 * dVar91 * (dVar90 + -3.0)) * local_108 +
                                  (dVar87 * 4.0 * local_a8 +
                                  (dVar86 + dVar86) * local_158 +
                                  (local_1f8 * -8.0 + dVar96 * 7.0 + local_38 * -3.0 + dVar97) *
                                  -2.0 * dVar90 +
                                  (local_1f8 * 4.0 + dVar96 + dVar96 + dVar97) * 5.0 +
                                  (dVar86 * 3.0 + dVar88 * 8.0 * (double)puVar94) * dVar91) * dVar93
                                  + (local_a8 * 4.0 + (double)local_198 + -5.0) *
                                    (dVar92 * dVar91 + local_d8 * (double)puVar94 + dVar80) * -2.0);
                    local_1a8 = dVar93;
                    local_148 = puVar94;
                    uStack_140 = 0;
                    local_b8 = dVar91;
                  }
                  else {
                    pdVar13[(lVar57 + lVar66 + lVar43 + lVar62) - lVar71] = 0.0;
                    lVar71 = (long)(vcent->begin).x;
                    lVar27 = (lVar26 - (vcent->begin).z) * vcent->kstride;
                    lVar57 = (lVar56 - (vcent->begin).y) * vcent->jstride;
                    pdVar12 = vcent->p;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                    lVar66 = vcent->nstride;
                    pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                    lVar71 = (long)(bcent->begin).x;
                    lVar27 = (lVar26 - (bcent->begin).z) * bcent->kstride;
                    lVar57 = (lVar56 - (bcent->begin).y) * bcent->jstride;
                    pdVar12 = bcent->p;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                    lVar66 = bcent->nstride;
                    pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = -1.0;
                    lVar71 = (long)(local_1e0->begin).x;
                    lVar27 = (lVar26 - (local_1e0->begin).z) * local_1e0->kstride;
                    lVar57 = (lVar56 - (local_1e0->begin).y) * local_1e0->jstride;
                    pdVar12 = local_1e0->p;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                    lVar66 = local_1e0->nstride;
                    pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                    pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                    barea->p[((lVar26 - (barea->begin).z) * barea->kstride +
                             (lVar56 - (barea->begin).y) * barea->jstride + lVar43 + lVar62) -
                             (long)(barea->begin).x] = 0.0;
                    cell->p[((lVar26 - (cell->begin).z) * cell->kstride +
                            (lVar56 - (cell->begin).y) * cell->jstride + lVar43 + lVar62) -
                            (long)(cell->begin).x].flag = 0x40003;
                    *local_178 = *local_178 + 1;
                  }
                }
                else {
                  vfrac->p[((lVar26 - (vfrac->begin).z) * vfrac->kstride +
                           (lVar56 - (vfrac->begin).y) * vfrac->jstride + lVar43 + lVar62) -
                           (long)(vfrac->begin).x] = 0.0;
                  lVar71 = (long)(vcent->begin).x;
                  lVar27 = (lVar26 - (vcent->begin).z) * vcent->kstride;
                  lVar57 = (lVar56 - (vcent->begin).y) * vcent->jstride;
                  pdVar12 = vcent->p;
                  pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                  lVar66 = vcent->nstride;
                  pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                  pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                  lVar71 = (long)(bcent->begin).x;
                  lVar27 = (lVar26 - (bcent->begin).z) * bcent->kstride;
                  lVar57 = (lVar56 - (bcent->begin).y) * bcent->jstride;
                  pdVar12 = bcent->p;
                  pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                  lVar66 = bcent->nstride;
                  pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = -1.0;
                  pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = -1.0;
                  lVar71 = (long)(bnorm->begin).x;
                  lVar27 = (lVar26 - (bnorm->begin).z) * bnorm->kstride;
                  lVar57 = (lVar56 - (bnorm->begin).y) * bnorm->jstride;
                  pdVar12 = bnorm->p;
                  pdVar12[lVar43 + ((lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                  lVar66 = bnorm->nstride;
                  pdVar12[lVar43 + ((lVar66 + lVar27 + lVar57 + lVar62) - lVar71)] = 0.0;
                  pdVar12[lVar43 + ((lVar27 + lVar57 + lVar66 * 2 + lVar62) - lVar71)] = 0.0;
                  barea->p[((lVar26 - (barea->begin).z) * barea->kstride +
                           (lVar56 - (barea->begin).y) * barea->jstride + lVar43 + lVar62) -
                           (long)(barea->begin).x] = 0.0;
                  cell->p[((lVar26 - (cell->begin).z) * cell->kstride +
                          (lVar56 - (cell->begin).y) * cell->jstride + lVar43 + lVar62) -
                          (long)(cell->begin).x].flag = 0x40003;
                  local_178[1] = local_178[1] + 1;
                }
              }
              lVar62 = lVar62 + 1;
            } while (iVar22 + -2 + (int)lVar62 <= (int)uVar10);
          }
          lVar56 = lVar56 + 1;
          local_15c = local_15c + 1;
          iVar39 = local_1cc;
        } while (iVar38 <= (int)local_128);
      }
      lVar26 = lVar26 + 1;
      local_f0 = (ulong)((int)local_f0 + 1);
    } while (iVar77 <= (int)local_130);
  }
  if (extend_domain_face) {
    uVar19 = *(undefined8 *)((local_78->domain).smallend.vect + 2);
    auStack_1bc[1] = (uint)((ulong)*(undefined8 *)(local_78->domain).bigend.vect >> 0x20);
    uStack_1b4 = *(ulong *)((local_78->domain).bigend.vect + 2);
    local_1c8 = *(undefined8 *)(local_78->domain).smallend.vect;
    uStack_1c0 = (uint)uVar19;
    auStack_1bc[0] = (uint)((ulong)uVar19 >> 0x20);
    lVar26 = 0;
    do {
      if (*(char *)((long)(local_78->super_CoordSys).inv_dx + lVar26 + 0x19) == '\x01') {
        iVar22 = *(int *)((long)&local_1c8 + lVar26 * 4);
        uVar34 = auStack_1bc[lVar26];
        iVar39 = *(int *)((long)&local_238 + lVar26 * 4);
        uVar35 = auStack_22c[lVar26];
        if (iVar39 < iVar22) {
          iVar22 = iVar39;
        }
        *(int *)((long)&local_1c8 + lVar26 * 4) = iVar22;
        if ((int)uVar35 < (int)uVar34) {
          uVar35 = uVar34;
        }
        auStack_1bc[lVar26] = uVar35;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 3);
    if ((((int)local_238 < (int)(uint)local_1c8) || ((int)local_238._4_4_ < (int)local_1c8._4_4_))
       || (((int)uStack_230 < (int)uStack_1c0 ||
           ((((int)auStack_1bc[0] < (int)auStack_22c[0] ||
             ((int)auStack_1bc[1] < (int)auStack_22c[1])) ||
            (iVar39 = local_1cc, (int)(uint)uStack_1b4 < (int)(uint)local_224)))))) {
      local_198 = (uint *)CONCAT44(local_198._4_4_,(uint)local_224);
      iVar39 = local_1cc;
      if ((int)uStack_230 <= (int)(uint)local_224) {
        lVar26 = (long)(int)local_238;
        local_1d8 = (Array4<const_double> *)CONCAT44(local_1d8._4_4_,local_1c8._4_4_);
        local_218 = (Array4<const_double> *)CONCAT44(local_218._4_4_,(uint)uStack_1b4);
        uVar34 = uStack_230;
        do {
          if ((int)local_238._4_4_ <= (int)auStack_22c[1]) {
            lVar43 = (long)(int)uVar34;
            uVar35 = local_238._4_4_;
            uVar42 = (uint)uStack_1b4;
            if ((int)uVar34 < (int)(uint)uStack_1b4) {
              uVar42 = uVar34;
            }
            do {
              if ((int)local_238 <= (int)auStack_22c[0]) {
                local_148 = (uint *)(long)(int)uVar35;
                uVar40 = auStack_1bc[1];
                if ((int)uVar35 < (int)auStack_1bc[1]) {
                  uVar40 = uVar35;
                }
                if ((int)uVar35 < (int)local_1c8._4_4_) {
                  uVar40 = local_1c8._4_4_;
                }
                local_1a8 = (double)CONCAT71(local_1a8._1_7_,(int)uVar35 < (int)local_1c8._4_4_);
                lVar74 = (long)(cell->begin).x;
                lVar29 = (long)(cell->begin).y;
                pEVar11 = cell->p;
                lVar32 = cell->jstride;
                local_1f8 = (double)(long)(cell->begin).z;
                lVar56 = cell->kstride;
                iVar22 = (vfrac->begin).x;
                iVar39 = (vfrac->begin).y;
                iVar77 = (vfrac->begin).z;
                lVar67 = (long)(vcent->begin).x;
                lVar44 = ((long)local_148 - lVar29) * lVar32;
                lVar59 = (lVar43 - (long)local_1f8) * lVar56;
                lVar60 = vcent->nstride;
                lVar45 = (lVar43 - (vcent->begin).z) * vcent->kstride;
                lVar30 = ((long)local_148 - (long)(vcent->begin).y) * vcent->jstride;
                lVar63 = (long)(bcent->begin).x;
                lVar61 = vfrac->kstride;
                lVar62 = vfrac->jstride;
                pdVar12 = vfrac->p;
                pdVar13 = vcent->p;
                lVar31 = (lVar43 - (bcent->begin).z) * bcent->kstride;
                lVar36 = ((long)local_148 - (long)(bcent->begin).y) * bcent->jstride;
                lVar66 = bcent->nstride;
                pdVar14 = bcent->p;
                local_208 = pdVar14 + lVar26 + ((lVar31 + lVar36) - lVar63);
                lVar64 = (lVar43 - (local_1e0->begin).z) * local_1e0->kstride;
                lVar37 = ((long)local_148 - (long)(local_1e0->begin).y) * local_1e0->jstride;
                lVar71 = local_1e0->nstride;
                lVar46 = (long)(local_1e0->begin).x;
                pdVar78 = local_1e0->p;
                iVar38 = (barea->begin).z;
                iVar23 = (barea->begin).y;
                lVar57 = barea->kstride;
                lVar27 = barea->jstride;
                iVar1 = (barea->begin).x;
                pdVar15 = barea->p;
                lVar65 = 0;
                do {
                  lVar47 = lVar26 + lVar65;
                  uVar70 = (int)lVar65 + (int)local_238;
                  if ((int)auStack_1bc[0] <= (int)uVar70) {
                    uVar70 = auStack_1bc[0];
                  }
                  if (lVar47 < (int)(uint)local_1c8) {
                    uVar70 = (uint)local_1c8;
                  }
                  uVar72 = uStack_1c0;
                  if (((((int)uVar34 < (int)uStack_1c0) ||
                       (uVar72 = uVar42,
                       ((int)auStack_1bc[1] < (int)uVar35 || lVar47 < (int)(uint)local_1c8) ||
                       ((int)uVar35 < (int)local_1c8._4_4_ || (int)(uint)uStack_1b4 < (int)uVar34)))
                      || ((int)auStack_1bc[0] < lVar47)) &&
                     (((~pEVar11[lVar26 + ((lVar59 + lVar44 + lVar65) - lVar74)].flag & 3) != 0 &&
                      ((~pEVar11[((int)uVar40 - lVar29) * lVar32 +
                                 ((int)uVar70 - lVar74) +
                                 ((long)(int)uVar72 - (long)local_1f8) * lVar56].flag & 3) == 0))))
                  {
                    *local_178 = *local_178 + 1;
                    pdVar12[lVar26 + (((lVar43 - iVar77) * lVar61 +
                                      ((long)local_148 - (long)iVar39) * lVar62 + lVar65) -
                                     (long)iVar22)] = 0.0;
                    pdVar13[lVar26 + ((lVar45 + lVar30 + lVar65) - lVar67)] = 0.0;
                    pdVar13[lVar26 + ((lVar60 + lVar45 + lVar30 + lVar65) - lVar67)] = 0.0;
                    pdVar13[lVar26 + ((lVar45 + lVar30 + lVar60 * 2 + lVar65) - lVar67)] = 0.0;
                    local_208[lVar65] = -1.0;
                    pdVar14[lVar26 + ((lVar66 + lVar31 + lVar36 + lVar65) - lVar63)] = -1.0;
                    pdVar14[lVar26 + ((lVar31 + lVar36 + lVar66 * 2 + lVar65) - lVar63)] = -1.0;
                    pdVar78[lVar26 + ((lVar64 + lVar37 + lVar65) - lVar46)] = 0.0;
                    pdVar78[lVar26 + ((lVar71 + lVar64 + lVar37 + lVar65) - lVar46)] = 0.0;
                    pdVar78[lVar26 + ((lVar64 + lVar37 + lVar71 * 2 + lVar65) - lVar46)] = 0.0;
                    pdVar15[lVar26 + (((lVar43 - iVar38) * lVar57 +
                                      ((long)local_148 - (long)iVar23) * lVar27 + lVar65) -
                                     (long)iVar1)] = 0.0;
                    pEVar11[lVar26 + ((lVar59 + lVar44 + lVar65) - lVar74)].flag = 0x40003;
                  }
                  lVar65 = lVar65 + 1;
                } while (~auStack_22c[0] + (int)local_238 + (int)lVar65 != 0);
              }
              bVar79 = uVar35 != auStack_22c[1];
              uVar35 = uVar35 + 1;
            } while (bVar79);
          }
          bVar79 = uVar34 != (uint)local_224;
          iVar39 = local_1cc;
          uVar34 = uVar34 + 1;
        } while (bVar79);
      }
    }
  }
  *local_68 = *local_68 + *local_178;
  iVar22 = *local_70 + local_178[1];
  *local_70 = iVar22;
  if (iVar22 < 1 && *local_68 < 1) {
    if ((int)uVar51 <= local_dc) {
      uVar34 = (int)local_128 + 2;
      local_128 = (ulong)uVar34;
      uVar35 = (int)local_130 + 2;
      local_130 = (ulong)uVar35;
      do {
        if ((int)local_1d0 <= (int)local_164) {
          local_c8 = cell->p;
          local_d8 = (double)cell->jstride;
          local_148 = (uint *)cell->kstride;
          iVar22 = uVar51 + 1;
          local_218 = (Array4<const_double> *)local_210->p;
          local_1d8 = (Array4<const_double> *)local_210->jstride;
          lVar26 = local_210->kstride;
          local_1a8 = (double)CONCAT44(local_1a8._4_4_,iVar22);
          uVar42 = local_1d0;
          do {
            if (iVar39 <= (int)local_160) {
              puVar94 = local_e8->p;
              lVar43 = local_e8->jstride;
              lVar32 = local_e8->kstride;
              local_98 = local_180->p;
              local_a8 = (double)local_180->jstride;
              lVar56 = local_180->kstride;
              iVar38 = uVar42 + 1;
              puVar16 = local_120->p;
              lVar60 = local_120->jstride;
              local_108 = (double)local_120->kstride;
              iVar77 = iVar39;
              do {
                lVar61 = (long)iVar77;
                lVar62 = lVar61 - (cell->begin).x;
                lVar71 = (long)(int)uVar42;
                lVar66 = (lVar71 - (cell->begin).y) * (long)local_d8;
                dVar76 = (double)(long)(int)uVar51;
                lVar57 = ((long)dVar76 - (long)(cell->begin).z) * (long)local_148;
                uVar40 = local_c8[lVar66 + lVar62 + lVar57].flag;
                if ((~uVar40 & 3) == 0) {
                  uVar40 = uVar40 & 0x1f;
                }
                else {
                  iVar39 = (local_e8->begin).x;
                  uVar70 = (local_e8->begin).y;
                  lVar29 = (long)(iVar77 - iVar39);
                  lVar27 = (int)(uVar42 - uVar70) * lVar43;
                  uVar72 = (local_e8->begin).z;
                  lVar30 = (int)(uVar51 - uVar72) * lVar32;
                  uVar2 = puVar94[lVar27 + lVar29 + lVar30];
                  uVar25 = uVar40 & 0xfffdffff;
                  if (uVar2 != 1) {
                    uVar25 = uVar40;
                  }
                  iVar23 = iVar77 + 1;
                  local_170 = (Array4<const_double> *)(long)(iVar23 - iVar39);
                  uVar40 = puVar94[(long)&local_170->p + lVar27 + lVar30];
                  uVar5 = uVar25 & 0xfff7ffff;
                  if (uVar40 != 1) {
                    uVar5 = uVar25;
                  }
                  uVar25 = (local_180->begin).x;
                  iVar39 = (local_180->begin).y;
                  lVar37 = (long)(int)(iVar77 - uVar25);
                  lVar31 = (long)(int)(uVar42 - iVar39) * (long)local_a8;
                  uVar3 = (local_180->begin).z;
                  local_1f8 = (double)CONCAT44(local_1f8._4_4_,uVar3);
                  lVar36 = (int)(uVar51 - uVar3) * lVar56;
                  uVar4 = local_98[lVar31 + lVar37 + lVar36];
                  uVar6 = uVar5 & 0xffff7fff;
                  if (uVar4 != 1) {
                    uVar6 = uVar5;
                  }
                  local_118 = (Array4<const_double> *)
                              (local_98 + (long)(iVar38 - iVar39) * (long)local_a8);
                  local_198 = (uint *)((long)&local_118->p + lVar37 * 4);
                  uVar5 = local_198[lVar36];
                  uVar9 = uVar6 & 0xffdfffff;
                  if (uVar5 != 1) {
                    uVar9 = uVar6;
                  }
                  uVar6 = (local_120->begin).x;
                  local_b8 = (double)CONCAT44(local_b8._4_4_,uVar6);
                  lVar44 = (long)(int)(iVar77 - uVar6);
                  uVar7 = (local_120->begin).y;
                  iVar39 = (local_120->begin).z;
                  local_110 = (Real)((long)(int)(uVar51 - iVar39) * (long)local_108);
                  local_208 = (double *)(puVar16 + (int)(uVar42 - uVar7) * lVar60);
                  uVar8 = *(uint *)((long)local_208 + (lVar44 + (long)local_110) * 4);
                  uVar73 = uVar9 & 0xfffffdff;
                  if (uVar8 != 1) {
                    uVar73 = uVar9;
                  }
                  lVar45 = (long)(iVar22 - iVar39) * (long)local_108;
                  uVar9 = *(uint *)((long)local_208 + (lVar44 + lVar45) * 4);
                  local_1e0 = (Array4<double> *)CONCAT44(local_1e0._4_4_,uVar9);
                  uVar24 = uVar73 & 0xf7ffffff;
                  if (uVar9 != 1) {
                    uVar24 = uVar73;
                  }
                  if ((uVar2 == 1) || (local_98[lVar31 + (int)(~uVar25 + iVar77) + lVar36] == 1)) {
                    uVar73 = uVar24 & 0xffffbfff;
                    if (uVar4 == 1) {
                      uVar24 = uVar73;
                    }
                    if (puVar94[(int)(uVar42 + ~uVar70) * lVar43 + lVar29 + lVar30] == 1) {
                      uVar24 = uVar73;
                    }
                  }
                  if ((uVar40 == 1) || (local_98[lVar31 + (int)(iVar23 - uVar25) + lVar36] == 1)) {
                    uVar73 = uVar24 & 0xfffeffff;
                    if (uVar4 == 1) {
                      uVar24 = uVar73;
                    }
                    if (puVar94[(long)&local_170->p + (int)(~uVar70 + uVar42) * lVar43 + lVar30] ==
                        1) {
                      uVar24 = uVar73;
                    }
                  }
                  uVar73 = uVar24;
                  if ((uVar2 == 1) ||
                     (*(int *)((long)&local_118->p + lVar36 * 4 + (long)(int)(~uVar25 + iVar77) * 4)
                      == 1)) {
                    if (uVar5 == 1) {
                      uVar73 = uVar24 & 0xffefffff;
                    }
                    if (puVar94[(int)(iVar38 - uVar70) * lVar43 + lVar29 + lVar30] == 1) {
                      uVar73 = uVar24 & 0xffefffff;
                    }
                  }
                  uVar24 = uVar73;
                  if ((uVar40 == 1) ||
                     (*(int *)((long)&local_118->p + lVar36 * 4 + (long)(int)(iVar23 - uVar25) * 4)
                      == 1)) {
                    if (uVar5 == 1) {
                      uVar24 = uVar73 & 0xffbfffff;
                    }
                    if (puVar94[(long)&local_170->p + (int)(iVar38 - uVar70) * lVar43 + lVar30] == 1
                       ) {
                      uVar24 = uVar73 & 0xffbfffff;
                    }
                  }
                  uVar70 = uVar24;
                  if ((uVar2 == 1) ||
                     (*(uint *)((long)local_208 +
                               ((long)(int)(~uVar6 + iVar77) + (long)local_110) * 4) == 1)) {
                    if (uVar8 == 1) {
                      uVar70 = uVar24 & 0xfffffeff;
                    }
                    if (puVar94[lVar27 + lVar29 + (int)(uVar51 + ~uVar72) * lVar32] == 1) {
                      uVar70 = uVar24 & 0xfffffeff;
                    }
                  }
                  uVar25 = uVar70;
                  if ((uVar40 == 1) ||
                     (*(uint *)((long)local_208 +
                               ((long)(int)(iVar23 - uVar6) + (long)local_110) * 4) == 1)) {
                    if (uVar8 == 1) {
                      uVar25 = uVar70 & 0xfffffbff;
                    }
                    if (puVar94[(long)&local_170->p + lVar27 + (int)(~uVar72 + uVar51) * lVar32] ==
                        1) {
                      uVar25 = uVar70 & 0xfffffbff;
                    }
                  }
                  if ((uVar2 == 1) ||
                     (*(uint *)((long)local_208 + ((int)(iVar77 + ~uVar6) + lVar45) * 4) == 1)) {
                    uVar70 = uVar25 & 0xfbffffff;
                    if (uVar9 == 1) {
                      uVar25 = uVar70;
                    }
                    if (puVar94[lVar27 + lVar29 + (int)(iVar22 - uVar72) * lVar32] == 1) {
                      uVar25 = uVar70;
                    }
                  }
                  uVar70 = uVar25;
                  if ((uVar40 == 1) ||
                     (*(uint *)((long)local_208 + ((int)(iVar23 - uVar6) + lVar45) * 4) == 1)) {
                    if (uVar9 == 1) {
                      uVar70 = uVar25 & 0xefffffff;
                    }
                    if (puVar94[(long)&local_170->p + lVar27 + (int)(iVar22 - uVar72) * lVar32] == 1
                       ) {
                      uVar70 = uVar25 & 0xefffffff;
                    }
                  }
                  uVar40 = uVar70;
                  if ((uVar4 == 1) ||
                     (puVar16[(int)(~uVar7 + uVar42) * lVar60 + lVar44 + (long)local_110] == 1)) {
                    if (uVar8 == 1) {
                      uVar40 = uVar70 & 0xffffffbf;
                    }
                    if (local_98[lVar31 + lVar37 + (int)(uVar51 + ~uVar3) * lVar56] == 1) {
                      uVar40 = uVar70 & 0xffffffbf;
                    }
                  }
                  if ((uVar5 == 1) ||
                     (puVar16[(int)(iVar38 - uVar7) * lVar60 + lVar44 + (long)local_110] == 1)) {
                    uVar70 = uVar40 & 0xffffefff;
                    if (uVar8 == 1) {
                      uVar40 = uVar70;
                    }
                    if (local_198[(int)(~uVar3 + uVar51) * lVar56] == 1) {
                      uVar40 = uVar70;
                    }
                  }
                  uVar70 = uVar40;
                  if ((uVar4 == 1) ||
                     (puVar16[(int)(~uVar7 + uVar42) * lVar60 + lVar44 + lVar45] == 1)) {
                    if (uVar9 == 1) {
                      uVar70 = uVar40 & 0xfeffffff;
                    }
                    if (local_98[lVar31 + lVar37 + (int)(iVar22 - uVar3) * lVar56] == 1) {
                      uVar70 = uVar40 & 0xfeffffff;
                    }
                  }
                  uVar40 = uVar70;
                  local_158 = dVar76;
                  if ((uVar5 == 1) ||
                     (puVar16[(int)(iVar38 - uVar7) * lVar60 + lVar44 + lVar45] == 1)) {
                    if (uVar9 == 1) {
                      uVar40 = uVar70 & 0xbfffffff;
                    }
                    if (local_198[(int)(iVar22 - uVar3) * lVar56] == 1) {
                      uVar40 = uVar70 & 0xbfffffff;
                    }
                  }
                }
                iVar77 = iVar77 + 1;
                local_c8[lVar66 + lVar62 + lVar57].flag = uVar40;
                *(uint32_t *)
                 ((long)local_218 +
                 ((long)dVar76 - (long)(local_210->begin).z) * lVar26 * 4 +
                 (lVar61 - (local_210->begin).x) * 4 +
                 (lVar71 - (local_210->begin).y) * (long)local_1d8 * 4) =
                     local_c8[(lVar71 - (cell->begin).y) * (long)local_d8 +
                              (lVar61 - (cell->begin).x) +
                              ((long)dVar76 - (long)(cell->begin).z) * (long)local_148].flag;
                iVar39 = local_1cc;
              } while (iVar77 != uVar10 + 2);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar34);
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 != uVar35);
    }
    iVar22 = (local_80->smallend).vect[2];
    iVar39 = (local_80->bigend).vect[2];
    uVar19 = local_1c8;
    if (iVar22 <= iVar39) {
      iVar77 = (local_80->smallend).vect[0];
      iVar38 = (local_80->smallend).vect[1];
      iVar23 = (local_80->bigend).vect[0];
      iVar1 = (local_80->bigend).vect[1];
      local_1f8 = (double)CONCAT44(local_1f8._4_4_,iVar77);
      do {
        if (iVar38 <= iVar1) {
          pEVar11 = cell->p;
          lVar26 = cell->jstride;
          lVar43 = cell->kstride;
          iVar54 = iVar22 + 1;
          iVar55 = iVar38;
          do {
            if (iVar77 <= iVar23) {
              pEVar18 = local_210->p;
              lVar32 = local_210->jstride;
              lVar56 = local_210->kstride;
              iVar41 = iVar55 + 1;
              iVar28 = iVar77;
              do {
                lVar60 = (long)(iVar28 - (cell->begin).x);
                lVar61 = ((long)iVar55 - (long)(cell->begin).y) * lVar26;
                lVar62 = ((long)iVar22 - (long)(cell->begin).z) * lVar43;
                if ((~pEVar11[lVar61 + lVar60 + lVar62].flag & 3) != 0) {
                  uVar10 = (local_210->begin).x;
                  uVar51 = (local_210->begin).y;
                  iVar58 = iVar28 - uVar10;
                  lVar57 = (long)iVar58;
                  lVar66 = (int)(iVar55 - uVar51) * lVar32;
                  uVar34 = (local_210->begin).z;
                  lVar71 = (int)(iVar22 - uVar34) * lVar56;
                  uVar35 = pEVar18[lVar66 + lVar57 + lVar71].flag;
                  sVar50 = (short)uVar35;
                  uVar42 = uVar35;
                  if (((((uVar35 >> 0x11 & 1) == 0) ||
                       ((pEVar18[lVar66 + (int)(~uVar10 + iVar28) + lVar71].flag & 0x40) == 0)) &&
                      ((-1 < sVar50 ||
                       ((pEVar18[(int)(~uVar51 + iVar55) * lVar32 + lVar57 + lVar71].flag & 0x100)
                        == 0)))) &&
                     (((uVar35 >> 9 & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(~uVar34 + iVar22) * lVar56].flag & 0x4000)
                       == 0)))) {
                    uVar42 = uVar35 & 0xffffffdf;
                  }
                  if (((((uVar35 >> 0x13 & 1) == 0) ||
                       ((pEVar18[lVar66 + (iVar58 + 1) + lVar71].flag & 0x40) == 0)) &&
                      ((-1 < sVar50 ||
                       ((pEVar18[(int)(~uVar51 + iVar55) * lVar32 + lVar57 + lVar71].flag & 0x400)
                        == 0)))) &&
                     (((uVar35 >> 9 & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(~uVar34 + iVar22) * lVar56].flag & 0x10000)
                       == 0)))) {
                    uVar42 = uVar42 & 0xffffff7f;
                  }
                  if (((((uVar35 >> 0x11 & 1) == 0) ||
                       ((pEVar18[lVar66 + (int)(~uVar10 + iVar28) + lVar71].flag & 0x1000) == 0)) &&
                      (((uVar35 >> 0x15 & 1) == 0 ||
                       ((pEVar18[(int)(iVar41 - uVar51) * lVar32 + lVar57 + lVar71].flag & 0x100) ==
                        0)))) &&
                     (((uVar35 >> 9 & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(~uVar34 + iVar22) * lVar56].flag & 0x100000)
                       == 0)))) {
                    uVar42 = uVar42 & 0xfffff7ff;
                  }
                  if (((((uVar35 >> 0x13 & 1) == 0) ||
                       ((pEVar18[lVar66 + (iVar58 + 1) + lVar71].flag & 0x1000) == 0)) &&
                      (((uVar35 >> 0x15 & 1) == 0 ||
                       ((pEVar18[(int)(iVar41 - uVar51) * lVar32 + lVar57 + lVar71].flag & 0x400) ==
                        0)))) &&
                     (((uVar35 >> 9 & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(~uVar34 + iVar22) * lVar56].flag & 0x400000)
                       == 0)))) {
                    uVar42 = uVar42 & 0xffffdfff;
                  }
                  if (((((uVar35 >> 0x11 & 1) == 0) ||
                       ((pEVar18[lVar66 + (int)(~uVar10 + iVar28) + lVar71].flag & 0x1000000) == 0))
                      && ((-1 < sVar50 ||
                          ((pEVar18[(int)(~uVar51 + iVar55) * lVar32 + lVar57 + lVar71].flag &
                           0x4000000) == 0)))) &&
                     (((uVar35 >> 0x1b & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(iVar54 - uVar34) * lVar56].flag & 0x4000) ==
                       0)))) {
                    uVar42 = uVar42 & 0xff7fffff;
                  }
                  if (((((uVar35 >> 0x13 & 1) == 0) ||
                       ((pEVar18[lVar66 + (iVar58 + 1) + lVar71].flag & 0x1000000) == 0)) &&
                      ((-1 < sVar50 ||
                       ((pEVar18[(int)(~uVar51 + iVar55) * lVar32 + lVar57 + lVar71].flag &
                        0x10000000) == 0)))) &&
                     (((uVar35 >> 0x1b & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(iVar54 - uVar34) * lVar56].flag & 0x10000)
                       == 0)))) {
                    uVar42 = uVar42 & 0xfdffffff;
                  }
                  if (((((uVar35 >> 0x11 & 1) == 0) ||
                       ((pEVar18[lVar66 + (int)(~uVar10 + iVar28) + lVar71].flag & 0x40000000) == 0)
                       ) && (((uVar35 >> 0x15 & 1) == 0 ||
                             ((pEVar18[(int)(iVar41 - uVar51) * lVar32 + lVar57 + lVar71].flag &
                              0x4000000) == 0)))) &&
                     (((uVar35 >> 0x1b & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(iVar54 - uVar34) * lVar56].flag & 0x100000)
                       == 0)))) {
                    uVar42 = uVar42 & 0xdfffffff;
                  }
                  if (((((uVar35 >> 0x13 & 1) == 0) ||
                       ((pEVar18[lVar66 + (iVar58 + 1) + lVar71].flag & 0x40000000) == 0)) &&
                      (((uVar35 >> 0x15 & 1) == 0 ||
                       ((pEVar18[(int)(iVar41 - uVar51) * lVar32 + lVar57 + lVar71].flag &
                        0x10000000) == 0)))) &&
                     (((uVar35 >> 0x1b & 1) == 0 ||
                      ((pEVar18[lVar66 + lVar57 + (int)(iVar54 - uVar34) * lVar56].flag & 0x400000)
                       == 0)))) {
                    uVar42 = uVar42 & 0x7fffffff;
                  }
                  pEVar11[lVar61 + lVar60 + lVar62].flag = uVar42;
                }
                iVar28 = iVar28 + 1;
              } while (iVar23 + 1 != iVar28);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != iVar1 + 1);
        }
        iVar22 = iVar22 + 1;
      } while (iVar22 != iVar39 + 1);
    }
  }
  else {
    if ((~cover_multiple_cuts & 0 < iVar22) == 1) {
      Abort_host("amrex::EB2::build_cells: multi-cuts not supported");
    }
    auStack_1bc[1] = auStack_22c[1];
    uStack_1b4 = local_224;
    local_1c8 = local_238;
    uVar19 = local_1c8;
    uStack_1c0 = uStack_230;
    auStack_1bc[0] = auStack_22c[0];
    lVar26 = 0;
    do {
      if ((uStack_1b4._4_4_ >> ((uint)lVar26 & 0x1f) & 1) == 0) {
        auStack_1bc[lVar26] = auStack_1bc[lVar26] + 1;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 3);
    iVar22 = (uint)local_224 + ((local_224 & 0x400000000) == 0);
    local_198 = (uint *)CONCAT44(local_198._4_4_,(uint)uStack_1b4);
    if ((int)uStack_230 <= (int)(uint)uStack_1b4) {
      local_158 = (double)(ulong)auStack_1bc[1];
      local_1c8._4_4_ = (uint)((ulong)local_238 >> 0x20);
      lVar56 = (long)(int)local_1c8._4_4_;
      local_1c8._0_4_ = (uint)local_238;
      lVar66 = (long)(int)(uint)local_1c8;
      lVar60 = (long)(int)auStack_22c[1];
      lVar61 = (long)(int)auStack_22c[0];
      lVar62 = (long)(int)local_1c8._4_4_;
      lVar71 = (long)(int)(uint)local_1c8;
      lVar32 = (long)(int)((~local_224._4_4_ & 1) + auStack_22c[0]);
      lVar43 = (long)(int)(auStack_22c[1] + ((local_224 & 0x200000000) == 0));
      lVar26 = lVar66 * 4;
      local_b8 = (double)(lVar56 + -1);
      local_318 = uStack_230 - 1;
      local_1e0 = (Array4<double> *)(lVar66 * 8);
      uVar10 = uStack_230;
      do {
        if ((int)local_1c8._4_4_ <= (int)auStack_1bc[1]) {
          lVar27 = (long)local_318;
          lVar30 = (long)(int)uVar10;
          iVar39 = uVar10 - 1;
          lVar31 = local_60->jstride * 8;
          lVar29 = (long)local_1e0 +
                   (lVar56 - (local_60->begin).y) * lVar31 +
                   (lVar30 - (local_60->begin).z) * local_60->kstride * 8 +
                   (long)(local_60->begin).x * -8 + (long)local_60->p;
          lVar57 = lVar56;
          local_338 = local_b8;
          do {
            if ((int)(uint)local_1c8 <= (int)auStack_1bc[0]) {
              lVar46 = (long)(cell->begin).x;
              lVar59 = (long)(cell->begin).y;
              lVar63 = (long)(cell->begin).z;
              lVar47 = (long)(local_180->begin).z;
              lVar44 = local_180->kstride;
              lVar48 = (long)(local_120->begin).y;
              lVar45 = local_120->jstride;
              pEVar11 = cell->p;
              lVar64 = cell->jstride * 4;
              lVar68 = ((long)local_338 - lVar59) * lVar64;
              lVar36 = cell->kstride * 4;
              lVar49 = (lVar27 - lVar63) * lVar36;
              lVar37 = lVar68 + lVar49;
              lVar64 = (lVar57 - lVar59) * lVar64;
              lVar49 = lVar49 + lVar64;
              lVar36 = (lVar30 - lVar63) * lVar36;
              lVar68 = lVar68 + lVar36;
              local_1f8 = (double)((long)&pEVar11[lVar66 - lVar46].flag + lVar36 + lVar64);
              lVar69 = (lVar57 - (local_180->begin).y) * local_180->jstride;
              lVar74 = lVar27 - lVar47;
              lVar47 = lVar30 - lVar47;
              lVar36 = (long)local_338 - lVar48;
              lVar48 = lVar57 - lVar48;
              lVar75 = (lVar30 - (local_120->begin).z) * local_120->kstride;
              lVar52 = (long)(local_120->begin).x;
              puVar94 = local_120->p;
              local_148 = puVar94 + ((lVar45 * lVar36 + lVar66 + lVar75 + -1) - lVar52);
              local_1d8 = (Array4<const_double> *)
                          (puVar94 + ((lVar45 * lVar48 + lVar66 + lVar75 + -1) - lVar52));
              local_218 = (Array4<const_double> *)
                          ((long)puVar94 + lVar45 * 4 * lVar36 + lVar75 * 4 + lVar52 * -4 + lVar26);
              lVar36 = (long)(local_e8->begin).y;
              lVar59 = (long)(local_180->begin).x;
              puVar16 = local_180->p;
              lVar63 = local_e8->jstride * 4;
              lVar53 = (lVar57 - lVar36) * lVar63;
              lVar63 = ((long)local_338 - lVar36) * lVar63;
              lVar36 = (long)(local_e8->begin).z;
              lVar65 = local_e8->kstride * 4;
              lVar67 = (lVar30 - lVar36) * lVar65;
              lVar65 = (lVar27 - lVar36) * lVar65;
              lVar64 = (long)(local_e8->begin).x;
              puVar17 = local_e8->p;
              local_1a8 = (double)((long)puVar17 + lVar53 + lVar67 + lVar64 * -4 + lVar26);
              local_208 = (double *)((long)puVar17 + lVar53 + lVar65 + lVar64 * -4 + lVar26);
              local_210 = (Array4<amrex::EBCellFlag> *)
                          ((long)puVar17 + lVar65 + lVar63 + lVar64 * -4 + lVar26);
              lVar36 = lVar57 + -1;
              lVar65 = 0;
              do {
                pdVar12 = (double *)(lVar29 + lVar65 * 8);
                if (0.0 < *pdVar12 || *pdVar12 == 0.0) goto LAB_0062246d;
                lVar53 = lVar66 + lVar65;
                lVar33 = lVar66 + lVar65 + -1;
                if (((((((lVar71 < lVar53) && (lVar33 <= lVar61)) && (lVar62 < lVar57)) &&
                      ((lVar36 <= lVar60 && ((int)uStack_230 < (int)uVar10)))) &&
                     ((iVar39 <= (int)(uint)local_224 &&
                      ((~*(uint *)((long)&pEVar11[lVar66 + ((lVar65 + -1) - lVar46)].flag + lVar37)
                       & 3) == 0)))) ||
                    (((((lVar71 <= lVar53 && (lVar53 <= lVar61)) && (lVar62 < lVar57)) &&
                      ((((lVar36 <= lVar60 && ((int)uStack_230 < (int)uVar10)) &&
                        (iVar39 <= (int)(uint)local_224)) &&
                       ((~*(uint *)((long)&pEVar11[lVar66 + (lVar65 - lVar46)].flag + lVar37) & 3)
                        == 0)))) ||
                     ((((lVar71 < lVar53 && (lVar33 <= lVar61)) &&
                       ((lVar62 <= lVar57 && ((lVar57 <= lVar60 && ((int)uStack_230 < (int)uVar10)))
                        ))) && ((iVar39 <= (int)(uint)local_224 &&
                                ((~*(uint *)((long)&pEVar11[lVar66 + ((lVar65 + -1) - lVar46)].flag
                                            + lVar49) & 3) == 0)))))))) ||
                   (((((lVar71 <= lVar53 && (lVar53 <= lVar61)) && (lVar62 <= lVar57)) &&
                     (((lVar57 <= lVar60 && ((int)uStack_230 < (int)uVar10)) &&
                      ((iVar39 <= (int)(uint)local_224 &&
                       ((~*(uint *)((long)&pEVar11[lVar66 + (lVar65 - lVar46)].flag + lVar49) & 3)
                        == 0)))))) ||
                    (((((lVar71 < lVar53 && (lVar33 <= lVar61)) && (lVar62 < lVar57)) &&
                      ((((lVar36 <= lVar60 && ((int)uStack_230 <= (int)uVar10)) &&
                        ((int)uVar10 <= (int)(uint)local_224)) &&
                       ((~*(uint *)((long)&pEVar11[lVar66 + ((lVar65 + -1) - lVar46)].flag + lVar68)
                        & 3) == 0)))) ||
                     (((((lVar71 <= lVar53 && (lVar53 <= lVar61)) &&
                        (((lVar62 < lVar57 &&
                          ((lVar36 <= lVar60 && ((int)uStack_230 <= (int)uVar10)))) &&
                         ((int)uVar10 <= (int)(uint)local_224)))) &&
                       ((~*(uint *)((long)&pEVar11[lVar66 + (lVar65 - lVar46)].flag + lVar68) & 3)
                        == 0)) ||
                      (((((lVar71 < lVar53 && (lVar33 <= lVar61)) && (lVar62 <= lVar57)) &&
                        ((lVar57 <= lVar60 && ((int)uStack_230 <= (int)uVar10)))) &&
                       (((int)uVar10 <= (int)(uint)local_224 &&
                        ((~*(uint *)((long)local_1f8 + -4 + lVar65 * 4) & 3) == 0)))))))))))) {
LAB_00622465:
                  *(undefined8 *)(lVar29 + lVar65 * 8) = 0;
                }
                else if (lVar53 < lVar71) {
                  if (!cover_multiple_cuts) goto LAB_0062246d;
LAB_00621f8b:
                  if ((((((lVar71 < lVar53) && (lVar33 <= lVar61)) &&
                        ((((lVar62 <= lVar57 &&
                           ((lVar57 <= lVar43 && ((int)uStack_230 < (int)uVar10)))) &&
                          (iVar39 <= (int)(uint)local_224)) &&
                         (puVar16[(lVar44 * lVar74 + lVar66 + lVar69 + lVar65 + -1) - lVar59] == 1))
                        )) || ((((((lVar71 <= lVar53 && (lVar53 <= lVar61)) && (lVar62 <= lVar57))
                                 && ((lVar57 <= lVar43 && ((int)uStack_230 < (int)uVar10)))) &&
                                (iVar39 <= (int)(uint)local_224)) &&
                               (*(int *)((long)puVar16 +
                                        lVar65 * 4 +
                                        lVar69 * 4 + lVar44 * 4 * lVar74 + lVar59 * -4 + lVar26) ==
                                1)))) ||
                      ((((lVar71 < lVar53 && (lVar33 <= lVar61)) &&
                        ((lVar62 <= lVar57 &&
                         (((lVar57 <= lVar43 && ((int)uStack_230 <= (int)uVar10)) &&
                          ((int)uVar10 <= (int)(uint)local_224)))))) &&
                       (puVar16[(lVar44 * lVar47 + lVar66 + lVar69 + lVar65 + -1) - lVar59] == 1))))
                     || ((((((((lVar71 <= lVar53 && (lVar53 <= lVar61)) &&
                              ((lVar62 <= lVar57 &&
                               ((lVar57 <= lVar43 && ((int)uStack_230 <= (int)uVar10)))))) &&
                             ((int)uVar10 <= (int)(uint)local_224)) &&
                            (*(int *)((long)puVar16 +
                                     lVar65 * 4 +
                                     lVar47 * lVar44 * 4 + lVar69 * 4 + lVar59 * -4 + lVar26) == 1))
                           || ((((lVar71 < lVar53 && (lVar33 <= lVar61)) && (lVar62 < lVar57)) &&
                               (((lVar36 <= lVar60 && ((int)uStack_230 <= (int)uVar10)) &&
                                (((int)uVar10 <= iVar22 && (local_148[lVar65] == 1)))))))) ||
                          ((((lVar71 <= lVar53 && (lVar53 <= lVar61)) && (lVar62 < lVar57)) &&
                           ((((lVar36 <= lVar60 && ((int)uStack_230 <= (int)uVar10)) &&
                             ((int)uVar10 <= iVar22)) &&
                            (*(int *)((long)&local_218->p + lVar65 * 4) == 1)))))) ||
                         (((((lVar71 < lVar53 && (lVar33 <= lVar61)) &&
                            (((lVar62 <= lVar57 &&
                              ((lVar57 <= lVar60 && ((int)uStack_230 <= (int)uVar10)))) &&
                             ((int)uVar10 <= iVar22)))) &&
                           (*(uint *)((long)&local_1d8->p + lVar65 * 4) == 1)) ||
                          (((((lVar71 <= lVar53 && (lVar53 <= lVar61)) && (lVar62 <= lVar57)) &&
                            ((lVar57 <= lVar60 && ((int)uStack_230 <= (int)uVar10)))) &&
                           (((int)uVar10 <= iVar22 &&
                            (*(int *)((long)puVar94 +
                                     lVar65 * 4 +
                                     lVar48 * lVar45 * 4 + lVar75 * 4 + lVar52 * -4 + lVar26) == 1))
                           )))))))) goto LAB_00622465;
                }
                else if (((lVar61 < lVar53) || (lVar57 < lVar62)) ||
                        ((lVar60 < lVar57 ||
                         (((int)uVar10 < (int)uStack_230 || ((int)(uint)local_224 < (int)uVar10)))))
                        ) {
                  if (cover_multiple_cuts) goto LAB_006222a0;
                }
                else {
                  uVar51 = *(uint *)((long)local_1f8 + lVar65 * 4) & 3;
                  if (cover_multiple_cuts && uVar51 != 3) {
LAB_006222a0:
                    if (((((lVar57 <= lVar62 || lVar60 < lVar36) || lVar32 < lVar53) ||
                         ((int)uVar10 <= (int)uStack_230)) || ((int)(uint)local_224 < iVar39)) ||
                       (*(int *)((long)&local_210->p + lVar65 * 4) != 1)) {
                      if (((((lVar57 < lVar62 || lVar60 < lVar57) || lVar32 < lVar53) ||
                           ((int)uVar10 <= (int)uStack_230)) ||
                          (((int)(uint)local_224 < iVar39 ||
                           (*(uint *)((long)local_208 + lVar65 * 4) != 1)))) &&
                         ((((((lVar57 <= lVar62 || lVar60 < lVar36) || lVar32 < lVar53) ||
                             (int)uVar10 < (int)uStack_230 || ((int)(uint)local_224 < (int)uVar10))
                           || (*(int *)((long)puVar17 +
                                       lVar65 * 4 + lVar67 + lVar63 + lVar64 * -4 + lVar26) != 1))
                          && (((((lVar57 < lVar62 || lVar60 < lVar57) || lVar32 < lVar53) ||
                                (int)uVar10 < (int)uStack_230 ||
                               ((int)(uint)local_224 < (int)uVar10)) ||
                              (*(int *)((long)local_1a8 + lVar65 * 4) != 1)))))) goto LAB_00621f8b;
                    }
                    goto LAB_00622465;
                  }
                  if (uVar51 == 3) goto LAB_00622465;
                }
LAB_0062246d:
                lVar65 = lVar65 + 1;
              } while ((auStack_1bc[0] - (uint)local_1c8) + 1 != (int)lVar65);
            }
            lVar57 = lVar57 + 1;
            local_338 = (double)((long)local_338 + 1);
            lVar29 = lVar29 + lVar31;
          } while (auStack_1bc[1] + 1 != (int)lVar57);
        }
        local_318 = local_318 + 1;
        bVar79 = uVar10 != (uint)uStack_1b4;
        uVar10 = uVar10 + 1;
      } while (bVar79);
    }
  }
  local_1c8 = uVar19;
  free(local_178);
  return;
}

Assistant:

void build_cells (Box const& bx, Array4<EBCellFlag> const& cell,
                  Array4<Type_t> const& fx, Array4<Type_t> const& fy,
                  Array4<Type_t> const& fz, Array4<Real> const& apx,
                  Array4<Real> const& apy, Array4<Real> const& apz,
                  Array4<Real const> const& fcx, Array4<Real const> const& fcy,
                  Array4<Real const> const& fcz, Array4<Real const> const& m2x,
                  Array4<Real const> const& m2y, Array4<Real const> const& m2z,
                  Array4<Real> const& vfrac, Array4<Real> const& vcent,
                  Array4<Real> const& barea, Array4<Real> const& bcent,
                  Array4<Real> const& bnorm, Array4<EBCellFlag> const& ctmp,
                  Array4<Real> const& levset, Real small_volfrac, Geometry const& geom,
                  bool extend_domain_face, bool cover_multiple_cuts,
                  int& nsmallcells, int& nmulticuts) noexcept
{
    Gpu::Buffer<int> n_smallcell_multicuts = {0,0};
    int* hp = n_smallcell_multicuts.hostData();
    int* dp = n_smallcell_multicuts.data();

    const Box& bxg1 = amrex::grow(bx,1);
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bxg1, i, j, k,
    {
        bool is_small_cell = false;
        bool is_multicut = false;
        set_eb_cell(i, j, k, cell, apx, apy, apz, fcx, fcy, fcz, m2x, m2y, m2z,
                    vfrac, vcent, barea, bcent, bnorm, small_volfrac,
                    is_small_cell, is_multicut);
        if (is_small_cell) {
            Gpu::Atomic::Add(dp, 1);
        }
        if (is_multicut) {
            Gpu::Atomic::Add(dp+1, 1);
        }
    });

    // set cells in the extended region to covered if the
    // corresponding cell on the domain face is covered
    if(extend_domain_face) {

       Box gdomain = geom.Domain();
       for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
           if (geom.isPeriodic(idim)) {
               gdomain.setSmall(idim, std::min(gdomain.smallEnd(idim), bxg1.smallEnd(idim)));
               gdomain.setBig(idim, std::max(gdomain.bigEnd(idim), bxg1.bigEnd(idim)));
           }
       }

       if (! gdomain.contains(bxg1)) {
          AMREX_HOST_DEVICE_FOR_3D ( bxg1, i, j, k,
          {
              const auto & dlo = gdomain.loVect();
              const auto & dhi = gdomain.hiVect();

              // find the cell(ii,jj,kk) on the corr. domain face
              // this would have already been set to correct value
              bool in_extended_domain = false;
              int ii = i;
              int jj = j;
              int kk = k;
              if(i < dlo[0]) {
                  in_extended_domain = true;
                  ii = dlo[0];
              }
              else if(i > dhi[0]) {
                  in_extended_domain = true;
                  ii = dhi[0];
              }

              if(j < dlo[1]) {
                  in_extended_domain = true;
                  jj = dlo[1];
              }
              else if(j > dhi[1]) {
                  in_extended_domain = true;
                  jj = dhi[1];
              }

              if(k < dlo[2]) {
                  in_extended_domain = true;
                  kk = dlo[2];
              }
              else if(k > dhi[2]) {
                  in_extended_domain = true;
                  kk = dhi[2];
              }

              // set cell in extendable region to covered if necessary
              if( in_extended_domain && (! cell(i,j,k).isCovered())
                  && cell(ii,jj,kk).isCovered() )
              {
                  Gpu::Atomic::Add(dp, 1);
                  set_covered(i,j,k,cell,vfrac,vcent,barea,bcent,bnorm);
              }
          });
       }
    }

    n_smallcell_multicuts.copyToHost();
    nsmallcells += hp[0];
    nmulticuts  += hp[1];

    if (nsmallcells > 0 || nmulticuts > 0) {
        if (!cover_multiple_cuts && nmulticuts > 0) {
            amrex::Abort("amrex::EB2::build_cells: multi-cuts not supported");
        }
        Box const& nbxg1 = amrex::surroundingNodes(bxg1);
        Box const& bxg1x = amrex::surroundingNodes(bxg1,0);
        Box const& bxg1y = amrex::surroundingNodes(bxg1,1);
        Box const& bxg1z = amrex::surroundingNodes(bxg1,2);
        AMREX_HOST_DEVICE_FOR_3D(nbxg1, i, j, k,
        {
            if (levset(i,j,k) < Real(0.0)) {
                bool zero_levset = false;
                if        (bxg1.contains(i-1,j-1,k-1)
                           &&       cell(i-1,j-1,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j-1,k-1)
                           &&       cell(i  ,j-1,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j  ,k-1)
                           &&       cell(i-1,j  ,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j  ,k-1)
                           &&       cell(i  ,j  ,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j-1,k  )
                           &&       cell(i-1,j-1,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j-1,k  )
                           &&       cell(i  ,j-1,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j  ,k  )
                           &&       cell(i-1,j  ,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j  ,k  )
                           &&       cell(i  ,j  ,k  ).isCovered()) {
                    zero_levset = true;
                } else if (cover_multiple_cuts) {
                    if        (bxg1x.contains(i  ,j-1,k-1)
                               &&          fx(i  ,j-1,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j  ,k-1)
                               &&          fx(i  ,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j-1,k  )
                               &&          fx(i  ,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j  ,k  )
                               &&          fx(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i-1,j  ,k-1)
                               &&          fy(i-1,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i  ,j  ,k-1)
                               &&          fy(i  ,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i-1,j  ,k  )
                               &&          fy(i-1,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i  ,j  ,k  )
                               &&          fy(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i-1,j-1,k  )
                               &&          fz(i-1,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i  ,j-1,k  )
                               &&          fz(i  ,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i-1,j  ,k  )
                               &&          fz(i-1,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i  ,j  ,k  )
                               &&          fz(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    }
                }
                if (zero_levset) {
                    levset(i,j,k) = Real(0.0);
                }
            }
        });
        return;
    }

    // Build neighbors.  By default all 26 neighbors are already set.
    AMREX_HOST_DEVICE_FOR_3D ( bxg1, i, j, k,
    {
        if (cell(i,j,k).isCovered()) {
            cell(i,j,k).setDisconnected();
        } else {
            auto flg = cell(i,j,k);

            if (fx(i,j,k) == Type::covered) {
                flg.setDisconnected(-1,0,0);
            }
            if (fx(i+1,j,k) == Type::covered) {
                flg.setDisconnected(1,0,0);
            }
            if (fy(i,j,k) == Type::covered) {
                flg.setDisconnected(0,-1,0);
            }
            if (fy(i,j+1,k) == Type::covered) {
                flg.setDisconnected(0,1,0);
            }
            if (fz(i,j,k) == Type::covered) {
                flg.setDisconnected(0,0,-1);
            }
            if (fz(i,j,k+1) == Type::covered) {
                flg.setDisconnected(0,0,1);
            }

            // x-y
            if ((fx(i,j,k) == Type::covered || fy(i-1,j,k) == Type::covered) &&
                (fx(i,j-1,k) == Type::covered || fy(i,j,k) == Type::covered))
            {
                flg.setDisconnected(-1,-1,0);
            }

            if ((fx(i+1,j,k) == Type::covered || fy(i+1,j,k) == Type::covered) &&
                (fx(i+1,j-1,k) == Type::covered || fy(i,j,k) == Type::covered))
            {
                flg.setDisconnected(1,-1,0);
            }

            if ((fx(i,j,k) == Type::covered || fy(i-1,j+1,k) == Type::covered) &&
                (fx(i,j+1,k) == Type::covered || fy(i,j+1,k) == Type::covered))
            {
                flg.setDisconnected(-1,1,0);
            }

            if ((fx(i+1,j,k) == Type::covered || fy(i+1,j+1,k) == Type::covered) &&
                (fx(i+1,j+1,k) == Type::covered || fy(i,j+1,k) == Type::covered))
            {
                flg.setDisconnected(1,1,0);
            }

            // x-z
            if ((fx(i,j,k) == Type::covered || fz(i-1,j,k) == Type::covered) &&
                (fx(i,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(-1,0,-1);
            }

            if ((fx(i+1,j,k) == Type::covered || fz(i+1,j,k) == Type::covered) &&
                (fx(i+1,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(1,0,-1);
            }

            if ((fx(i,j,k) == Type::covered || fz(i-1,j,k+1) == Type::covered) &&
                (fx(i,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(-1,0,1);
            }

            if ((fx(i+1,j,k) == Type::covered || fz(i+1,j,k+1) == Type::covered) &&
                (fx(i+1,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(1,0,1);
            }

            // y-z
            if ((fy(i,j,k) == Type::covered || fz(i,j-1,k) == Type::covered) &&
                (fy(i,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(0,-1,-1);
            }

            if ((fy(i,j+1,k) == Type::covered || fz(i,j+1,k) == Type::covered) &&
                (fy(i,j+1,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(0,1,-1);
            }

            if ((fy(i,j,k) == Type::covered || fz(i,j-1,k+1) == Type::covered) &&
                (fy(i,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(0,-1,1);
            }

            if ((fy(i,j+1,k) == Type::covered || fz(i,j+1,k+1) == Type::covered) &&
                (fy(i,j+1,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(0,1,1);
            }

            cell(i,j,k) = flg;
        }

        ctmp(i,j,k) = cell(i,j,k);
    });

    AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
    {
        if (!cell(i,j,k).isCovered()) {
            auto tmpflg = ctmp(i,j,k);
            auto newflg = tmpflg;

            // -1, -1, -1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0,-1,-1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected(-1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected(-1,-1, 0)))
            {
                newflg.setDisconnected(-1,-1,-1);
            }

            // 1, -1, -1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0,-1,-1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected( 1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected( 1,-1, 0)))
            {
                newflg.setDisconnected(1,-1,-1);
            }

            // -1, 1, -1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0, 1,-1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected(-1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected(-1, 1, 0)))
            {
                newflg.setDisconnected(-1, 1,-1);
            }

            // 1, 1, -1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0, 1,-1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected( 1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected( 1, 1, 0)))
            {
                newflg.setDisconnected(1, 1,-1);
            }

            // -1, -1, 1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0,-1, 1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected(-1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected(-1,-1, 0)))
            {
                newflg.setDisconnected(-1,-1, 1);
            }

            // 1, -1, 1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0,-1, 1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected( 1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected( 1,-1, 0)))
            {
                newflg.setDisconnected(1,-1, 1);
            }

            // -1, 1, 1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0, 1, 1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected(-1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected(-1, 1, 0)))
            {
                newflg.setDisconnected(-1,1,1);
            }

            // 1, 1, 1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0, 1, 1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected( 1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected( 1, 1, 0)))
            {
                newflg.setDisconnected(1,1,1);
            }

            cell(i,j,k) = newflg;
        }
    });
}